

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O3

_Bool mptest_clear_row(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 7;
  do {
    iVar1 = rand();
    m256v_clear_row(Ml,iVar1 % nrow);
    m2v_clear_row(Ms,iVar1 % nrow);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return true;
}

Assistant:

static bool mptest_clear_row(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	for (int i = 0; i < 7; ++i) {
		const int r = rand() % nrow;

		m256v_clear_row(Ml, r);
		m2v_clear_row(Ms, r);
	}
	return true;
}